

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loguru.cpp
# Opt level: O0

void loguru::suggest_log_path(char *prefix,char *buff,uint buff_size)

{
  char *pcVar1;
  size_t sVar2;
  size_t sVar3;
  size_t n;
  uint buff_size_local;
  char *buff_local;
  char *prefix_local;
  
  if (*prefix == '~') {
    pcVar1 = home_dir();
    snprintf(buff,(ulong)(buff_size - 1),"%s%s",pcVar1,prefix + 1);
  }
  else {
    snprintf(buff,(ulong)(buff_size - 1),"%s",prefix);
  }
  sVar2 = strlen(buff);
  if ((sVar2 != 0) && (buff[sVar2 - 1] != '/')) {
    if ((ulong)buff_size <= sVar2 + 2) {
      log_and_abort(0,"CHECK FAILED:  n + 2 < buff_size  ",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/lscpp/external/loguru/loguru.cpp"
                    ,0x299,"Filename buffer too small");
    }
    buff[sVar2] = '/';
    buff[sVar2 + 1] = '\0';
  }
  pcVar1 = (char *)std::__cxx11::string::c_str();
  sVar2 = strlen(buff);
  strncat(buff,pcVar1,(buff_size - sVar2) - 1);
  sVar2 = strlen(buff);
  strncat(buff,"/",(buff_size - sVar2) - 1);
  sVar2 = strlen(buff);
  sVar3 = strlen(buff);
  write_date_time(buff + sVar2,buff_size - sVar3);
  sVar2 = strlen(buff);
  strncat(buff,".log",(buff_size - sVar2) - 1);
  return;
}

Assistant:

void suggest_log_path(const char* prefix, char* buff, unsigned buff_size)
	{
		if (prefix[0] == '~') {
			snprintf(buff, buff_size - 1, "%s%s", home_dir(), prefix + 1);
		} else {
			snprintf(buff, buff_size - 1, "%s", prefix);
		}

		// Check for terminating /
		size_t n = strlen(buff);
		if (n != 0) {
			if (buff[n - 1] != '/') {
				CHECK_F(n + 2 < buff_size, "Filename buffer too small");
				buff[n] = '/';
				buff[n + 1] = '\0';
			}
		}

		strncat(buff, s_argv0_filename.c_str(), buff_size - strlen(buff) - 1);
		strncat(buff, "/",                      buff_size - strlen(buff) - 1);
		write_date_time(buff + strlen(buff),    buff_size - strlen(buff));
		strncat(buff, ".log",                   buff_size - strlen(buff) - 1);
	}